

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O3

void __thiscall Assimp::IrrlichtBase::ReadStringProperty(IrrlichtBase *this,StringProperty *out)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar2;
  StringProperty *this_00;
  allocator local_59;
  StringProperty *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])();
  if (0 < iVar1) {
    local_58 = (StringProperty *)&out->value;
    uVar2 = 0;
    do {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar2);
      if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
LAB_00423ac9:
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                      ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      iVar1 = strcasecmp((char *)CONCAT44(extraout_var,iVar1),"name");
      if (iVar1 == 0) {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar2);
        std::__cxx11::string::string
                  ((string *)local_50,(char *)CONCAT44(extraout_var_02,iVar1),&local_59);
        this_00 = out;
LAB_00423a8b:
        std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      else {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar2);
        if ((char *)CONCAT44(extraout_var_00,iVar1) == (char *)0x0) goto LAB_00423ac9;
        iVar1 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar1),"value");
        if (iVar1 == 0) {
          iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar2);
          std::__cxx11::string::string
                    ((string *)local_50,(char *)CONCAT44(extraout_var_01,iVar1),&local_59);
          this_00 = local_58;
          goto LAB_00423a8b;
        }
      }
      uVar2 = uVar2 + 1;
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])();
    } while ((int)uVar2 < iVar1);
  }
  return;
}

Assistant:

void IrrlichtBase::ReadStringProperty (StringProperty& out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // simple copy the string
            out.value = std::string (reader->getAttributeValue(i));
        }
    }
}